

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

void FILEDosToUnixPathA(LPSTR lpPath)

{
  size_t sVar1;
  char local_21;
  LPSTR pCStack_20;
  char charBeforeFirstDot;
  LPSTR pPointAtDot;
  LPSTR p;
  LPSTR lpPath_local;
  
  pCStack_20 = (LPSTR)0x0;
  local_21 = '\0';
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pPointAtDot = lpPath;
  if (lpPath != (LPSTR)0x0) {
    for (; *pPointAtDot != '\0'; pPointAtDot = pPointAtDot + 1) {
      if (*pPointAtDot == '\\') {
        *pPointAtDot = '/';
      }
      if (pCStack_20 == (LPSTR)0x0) {
        if (*pPointAtDot == '.') {
          pCStack_20 = pPointAtDot;
          if (pPointAtDot == lpPath) {
            local_21 = *lpPath;
          }
          else {
            local_21 = pPointAtDot[-1];
          }
        }
      }
      else if (*pPointAtDot == '/') {
        if ((local_21 != '.') && (local_21 != '/')) {
          sVar1 = strlen(pPointAtDot);
          memmove(pCStack_20,pPointAtDot,sVar1 + 1);
          pPointAtDot = pCStack_20;
        }
        pCStack_20 = (LPSTR)0x0;
      }
      else if (*pPointAtDot == '*') {
        if (2 < (long)pPointAtDot - (long)lpPath) {
          if (((pPointAtDot[-2] == '*') && (pPointAtDot[-1] == '.')) && (*pPointAtDot == '*')) {
            sVar1 = strlen(pPointAtDot);
            memmove(pPointAtDot + -2,pPointAtDot,sVar1 + 1);
          }
          pCStack_20 = (LPSTR)0x0;
        }
      }
      else if (*pPointAtDot != '.') {
        pCStack_20 = (LPSTR)0x0;
      }
    }
    if (((pCStack_20 != (LPSTR)0x0) && (pCStack_20 != lpPath)) && (pCStack_20[-1] != '/')) {
      *pCStack_20 = '\0';
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  return;
}

Assistant:

void
FILEDosToUnixPathA(
       LPSTR lpPath)
{
    LPSTR p;
    LPSTR pPointAtDot=NULL;
    char charBeforeFirstDot='\0';

    TRACE("Original DOS path = [%s]\n", lpPath);

    if (!lpPath)
    {
        return;
    }

    for (p = lpPath; *p; p++)
    {
        /* Make the \\ to / switch first */
        if (*p == '\\')
        {
            /* Replace \ with / */
            *p = '/';
        }

        if (pPointAtDot)
        {
            /* If pPointAtDot is not NULL, it is pointing at the first encountered
               dot.  If we encountered a \, that means it could be a trailing dot */
            if (*p == '/')
            {
                /* If char before the first dot is a '\' or '.' (special case if the
                   dot is the first char in the path) , then we leave it alone,
                   because it is either . or .., otherwise it is a trailing dot
                   pattern and will be truncated */
                if (charBeforeFirstDot != '.' && charBeforeFirstDot != '/')
                {
                    memmove(pPointAtDot,p,(strlen(p)*sizeof(char))+1);
                    p = pPointAtDot;
                }
                pPointAtDot = NULL; /* Need to reset this */
            }
            else if (*p == '*')
            {
                /* Check our size before doing anything with our pointers */
                if ((p - lpPath) >= 3)
                {
                    /* At this point, we know that there is 1 or more dots and
                       then a star.  AND we know the size of our string at this
                       point is at least 3 (so we can go backwards from our pointer
                       safely AND there could possilby be two characters back)
                       So lets check if there is a '*' and a '.' before, if there
                       is, replace just a '*'.  Otherwise, reset pPointAtDot to NULL
                       and do nothing */
                    if (p[-2] == '*' &&
                        p[-1] == '.' &&
                        p[0] == '*')
                    {
                        memmove(&(p[-2]),p,(strlen(p)*sizeof(char))+1);
                    }

                    pPointAtDot  = NULL;
                }
            }
            else if (*p != '.')
            {
                /* If we are here, that means that this is NOT a trailing dot,
                   some other character is here, so forget our pointer */
                pPointAtDot = NULL;
            }
        }
        else
        {
            if (*p == '.')
            {
                /* If pPointAtDot is NULL, and we encounter a dot, save the pointer */
                pPointAtDot = p;
                if (pPointAtDot != lpPath)
                {
                    charBeforeFirstDot = p[-1];
                }
                else
                {
                    charBeforeFirstDot = lpPath[0];
                }
            }
        }
    }

    /* If pPointAtDot still points at anything, then we still have trailing dots.
       Truncate at pPointAtDot, unless the dots are path specifiers (. or ..) */
    if (pPointAtDot)
    {
        /* make sure the trailing dots don't follow a '/', and that they aren't
           the only thing in the name */
        if(pPointAtDot != lpPath && *(pPointAtDot-1) != '/')
        {
            *pPointAtDot = '\0';
        }
    }

    TRACE("Resulting Unix path = [%s]\n", lpPath);
}